

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

int hydro_hash_init(hydro_hash_state *state,char *ctx,uint8_t *key)

{
  size_t in_len;
  undefined1 auVar1 [16];
  undefined4 local_48;
  undefined2 local_44;
  undefined8 local_42;
  undefined2 local_3a;
  undefined1 uStack_38;
  undefined8 uStack_37;
  undefined7 uStack_2f;
  undefined1 uStack_28;
  undefined8 uStack_27;
  undefined5 uStack_1f;
  undefined3 uStack_1a;
  undefined1 auStack_17 [15];
  
  auVar1 = ZEXT816(0) << 0x40;
  local_48 = 0x616d6b04;
  local_44 = 0x863;
  local_3a = 0;
  uStack_37 = auVar1._3_8_;
  uStack_2f = 0;
  uStack_28 = 0;
  uStack_27 = auVar1._1_8_;
  uStack_1f = 0;
  uStack_1a = 0;
  auStack_17 = (undefined1  [15])0x0;
  local_42 = *(undefined8 *)ctx;
  if (key == (uint8_t *)0x0) {
    in_len = 0x20;
    uStack_38 = 0;
  }
  else {
    uStack_37 = *(undefined8 *)key;
    uStack_27 = *(undefined8 *)(key + 0x10);
    in_len = 0x40;
    uStack_38 = 0x20;
    uStack_2f = (undefined7)*(undefined8 *)(key + 8);
    uStack_28 = (undefined1)((ulong)*(undefined8 *)(key + 8) >> 0x38);
    uStack_1f = (undefined5)*(undefined8 *)(key + 0x18);
    uStack_1a = (undefined3)((ulong)*(undefined8 *)(key + 0x18) >> 0x28);
  }
  *(undefined1 (*) [32])(state->state + 5) = ZEXT1632(auVar1);
  *(undefined1 (*) [32])state->state = ZEXT1632(auVar1);
  hydro_hash_update(state,&local_48,in_len);
  return 0;
}

Assistant:

int
hydro_hash_init(hydro_hash_state *state, const char ctx[hydro_hash_CONTEXTBYTES],
                const uint8_t key[hydro_hash_KEYBYTES])
{
    uint8_t block[64] = { 4, 'k', 'm', 'a', 'c', 8 };
    size_t  p;

    COMPILER_ASSERT(hydro_hash_KEYBYTES <= sizeof block - gimli_RATE - 1);
    COMPILER_ASSERT(hydro_hash_CONTEXTBYTES == 8);
    mem_zero(block + 14, sizeof block - 14);
    memcpy(block + 6, ctx, 8);
    if (key != NULL) {
        block[gimli_RATE] = (uint8_t) hydro_hash_KEYBYTES;
        memcpy(block + gimli_RATE + 1, key, hydro_hash_KEYBYTES);
        p = (gimli_RATE + 1 + hydro_hash_KEYBYTES + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    } else {
        block[gimli_RATE] = (uint8_t) 0;
        p                 = (gimli_RATE + 1 + 0 + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    }
    mem_zero(state, sizeof *state);
    hydro_hash_update(state, block, p);

    return 0;
}